

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_scan_sse41_128_64.c
# Opt level: O1

parasail_result_t *
parasail_nw_table_scan_profile_sse41_128_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  long lVar1;
  long *plVar2;
  void *pvVar3;
  parasail_matrix_t *ppVar4;
  int *piVar5;
  undefined1 auVar6 [16];
  int iVar7;
  parasail_result_t *ppVar8;
  __m128i *ptr;
  int64_t *ptr_00;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *ptr_03;
  long lVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  long lVar14;
  __m128i *palVar15;
  long lVar16;
  uint uVar17;
  ulong uVar19;
  long lVar20;
  long lVar21;
  int32_t segNum;
  long lVar22;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  int iVar26;
  ulong size;
  ulong uVar27;
  undefined1 auVar28 [12];
  __m128i alVar29;
  ulong uVar30;
  ulong uVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  int64_t iVar37;
  long lVar38;
  __m128i_64_t B_1;
  undefined1 auVar39 [16];
  long lVar40;
  long lVar41;
  undefined1 auVar42 [16];
  long lVar43;
  long lVar44;
  long lVar45;
  __m128i_64_t B;
  long lVar46;
  __m128i_64_t e;
  __m128i_64_t h;
  longlong local_58 [5];
  int iVar18;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_nw_table_scan_profile_sse41_128_64_cold_8();
  }
  else {
    pvVar3 = (profile->profile64).score;
    if (pvVar3 == (void *)0x0) {
      parasail_nw_table_scan_profile_sse41_128_64_cold_7();
    }
    else {
      ppVar4 = profile->matrix;
      if (ppVar4 == (parasail_matrix_t *)0x0) {
        parasail_nw_table_scan_profile_sse41_128_64_cold_6();
      }
      else {
        uVar17 = profile->s1Len;
        if ((int)uVar17 < 1) {
          parasail_nw_table_scan_profile_sse41_128_64_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_nw_table_scan_profile_sse41_128_64_cold_4();
        }
        else {
          uVar25 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            parasail_nw_table_scan_profile_sse41_128_64_cold_3();
          }
          else if (open < 0) {
            parasail_nw_table_scan_profile_sse41_128_64_cold_2();
          }
          else if (gap < 0) {
            parasail_nw_table_scan_profile_sse41_128_64_cold_1();
          }
          else {
            iVar13 = uVar17 - 1;
            size = (ulong)uVar17 + 1 >> 1;
            iVar26 = (int)size;
            iVar10 = -open;
            iVar18 = ppVar4->min;
            uVar12 = 0x8000000000000000 - (long)iVar18;
            if (iVar18 != iVar10 && SBORROW4(iVar18,iVar10) == iVar18 + open < 0) {
              uVar12 = (ulong)(uint)open | 0x8000000000000000;
            }
            iVar18 = ppVar4->max;
            ppVar8 = parasail_result_new_table1((uint)((ulong)uVar17 + 1) & 0x7ffffffe,s2Len);
            if (ppVar8 != (parasail_result_t *)0x0) {
              ppVar8->flag = ppVar8->flag | 0x2820401;
              ptr = parasail_memalign___m128i(0x10,size);
              ptr_00 = parasail_memalign_int64_t(0x10,(ulong)(s2Len + 1));
              ptr_01 = parasail_memalign___m128i(0x10,size);
              ptr_02 = parasail_memalign___m128i(0x10,size);
              ptr_03 = parasail_memalign___m128i(0x10,size);
              if (ptr_03 != (__m128i *)0x0 &&
                  ((ptr_02 != (__m128i *)0x0 && ptr_01 != (__m128i *)0x0) &&
                  (ptr_00 != (int64_t *)0x0 && ptr != (__m128i *)0x0))) {
                iVar7 = s2Len + -1;
                uVar27 = (ulong)(uint)open;
                uVar30 = (ulong)(uint)gap;
                lVar1 = uVar12 + 1;
                lVar9 = 0x7ffffffffffffffe - (long)iVar18;
                auVar33._8_4_ = (int)lVar1;
                auVar33._0_8_ = lVar1;
                auVar33._12_4_ = (int)((ulong)lVar1 >> 0x20);
                auVar35._8_4_ = (int)lVar9;
                auVar35._0_8_ = lVar9;
                auVar35._12_4_ = (int)((ulong)lVar9 >> 0x20);
                uVar11 = (ulong)(uint)gap;
                lVar14 = (long)iVar10;
                uVar19 = 0;
                do {
                  lVar22 = 0;
                  lVar20 = lVar14;
                  do {
                    local_58[lVar22 + 2] = lVar20;
                    local_58[lVar22] = lVar20 - (ulong)(uint)open;
                    lVar22 = lVar22 + 1;
                    lVar20 = lVar20 - size * uVar11;
                  } while (lVar22 == 1);
                  ptr_02[uVar19][0] = local_58[2];
                  ptr_02[uVar19][1] = local_58[3];
                  ptr[uVar19][0] = local_58[0];
                  ptr[uVar19][1] = local_58[1];
                  uVar19 = uVar19 + 1;
                  lVar14 = lVar14 - uVar11;
                } while (uVar19 != size);
                *ptr_00 = 0;
                lVar14 = (long)iVar10;
                uVar19 = 1;
                do {
                  ptr_00[uVar19] = lVar14;
                  uVar19 = uVar19 + 1;
                  lVar14 = lVar14 - uVar11;
                } while (s2Len + 1 != uVar19);
                lVar14 = -uVar27;
                uVar19 = (ulong)(uint)open;
                lVar20 = -uVar19;
                palVar15 = ptr_03 + (iVar26 - 1U);
                uVar11 = size;
                do {
                  (*palVar15)[0] = lVar14;
                  (*palVar15)[1] = lVar20;
                  lVar14 = lVar14 - uVar30;
                  uVar31 = (ulong)(uint)gap;
                  lVar20 = lVar20 - uVar31;
                  palVar15 = palVar15 + -1;
                  iVar18 = (int)uVar11;
                  uVar17 = iVar18 - 1;
                  uVar11 = (ulong)uVar17;
                } while (uVar17 != 0 && 0 < iVar18);
                palVar15 = ptr_02 + (iVar26 - 1U);
                uVar11 = 1;
                if (1 < s2Len) {
                  uVar11 = uVar25;
                }
                lVar20 = (ulong)(iVar26 + (uint)(iVar26 == 0)) << 4;
                lVar14 = 0;
                uVar23 = 0;
                auVar36 = auVar33;
                do {
                  auVar39._8_4_ = (int)(*palVar15)[0];
                  auVar39._0_8_ = (*palVar15)[0];
                  auVar39._12_4_ = *(undefined4 *)((long)*palVar15 + 4);
                  iVar18 = ppVar4->mapper[(byte)s2[uVar23]];
                  lVar22 = lVar1 - (*ptr_03)[0];
                  lVar41 = auVar33._8_8_ - (*ptr_03)[1];
                  lVar16 = 0;
                  auVar42 = auVar33;
                  iVar37 = ptr_00[uVar23];
                  lVar40 = auVar39._8_8_;
                  do {
                    plVar2 = (long *)((long)*ptr_02 + lVar16);
                    lVar24 = *plVar2;
                    lVar21 = plVar2[1];
                    plVar2 = (long *)((long)*ptr + lVar16);
                    lVar43 = *plVar2 - uVar30;
                    lVar44 = plVar2[1] - uVar31;
                    lVar45 = lVar24 - uVar27;
                    lVar46 = lVar21 - uVar19;
                    if (lVar45 < lVar43) {
                      lVar45 = lVar43;
                    }
                    if (lVar46 < lVar44) {
                      lVar46 = lVar44;
                    }
                    plVar2 = (long *)((long)pvVar3 + lVar16 + (long)iVar18 * (long)iVar26 * 0x10);
                    lVar38 = iVar37 + *plVar2;
                    lVar40 = lVar40 + plVar2[1];
                    plVar2 = (long *)((long)*ptr_03 + lVar16);
                    lVar44 = lVar22 + *plVar2;
                    lVar43 = lVar41 + plVar2[1];
                    if (lVar44 < auVar42._0_8_) {
                      lVar44 = auVar42._0_8_;
                    }
                    if (lVar43 < auVar42._8_8_) {
                      lVar43 = auVar42._8_8_;
                    }
                    lVar22 = lVar45;
                    if (lVar45 <= lVar38) {
                      lVar22 = lVar38;
                    }
                    lVar41 = lVar46;
                    if (lVar46 <= lVar40) {
                      lVar41 = lVar40;
                    }
                    auVar42._8_8_ = lVar43;
                    auVar42._0_8_ = lVar44;
                    plVar2 = (long *)((long)*ptr + lVar16);
                    *plVar2 = lVar45;
                    plVar2[1] = lVar46;
                    plVar2 = (long *)((long)*ptr_01 + lVar16);
                    *plVar2 = lVar22;
                    plVar2[1] = lVar41;
                    lVar16 = lVar16 + 0x10;
                    iVar37 = lVar24;
                    lVar40 = lVar21;
                  } while (lVar20 != lVar16);
                  lVar41 = ptr_00[uVar23 + 1];
                  uVar23 = uVar23 + 1;
                  lVar40 = (*ptr_03)[0] + lVar41;
                  if (lVar40 < lVar44) {
                    lVar40 = lVar44;
                  }
                  lVar16 = lVar1;
                  if (lVar1 < lVar41) {
                    lVar16 = lVar41;
                  }
                  lVar41 = lVar40;
                  if (lVar40 < lVar22) {
                    lVar41 = lVar22;
                  }
                  lVar21 = 0;
                  lVar22 = lVar14;
                  lVar24 = lVar1;
                  do {
                    lVar45 = lVar24 - uVar30;
                    lVar46 = lVar40 - uVar31;
                    lVar24 = lVar16 - uVar27;
                    if ((long)(lVar16 - uVar27) < lVar45) {
                      lVar24 = lVar45;
                    }
                    lVar40 = lVar41 - uVar19;
                    if ((long)(lVar41 - uVar19) < lVar46) {
                      lVar40 = lVar46;
                    }
                    lVar41 = *(long *)((long)*ptr_01 + lVar21);
                    lVar45 = *(long *)((long)*ptr_01 + lVar21 + 8);
                    lVar16 = lVar24;
                    if (lVar24 < lVar41) {
                      lVar16 = lVar41;
                    }
                    lVar41 = lVar40;
                    if (lVar40 < lVar45) {
                      lVar41 = lVar45;
                    }
                    lVar45 = auVar35._0_8_;
                    if (lVar16 <= auVar35._0_8_) {
                      lVar45 = lVar16;
                    }
                    lVar46 = auVar35._8_8_;
                    if (lVar41 <= auVar35._8_8_) {
                      lVar46 = lVar41;
                    }
                    plVar2 = (long *)((long)*ptr_02 + lVar21);
                    *plVar2 = lVar16;
                    plVar2[1] = lVar41;
                    lVar43 = auVar36._0_8_;
                    if (auVar36._0_8_ <= lVar16) {
                      lVar43 = lVar16;
                    }
                    lVar44 = auVar36._8_8_;
                    if (auVar36._8_8_ <= lVar41) {
                      lVar44 = lVar41;
                    }
                    auVar35._8_8_ = lVar46;
                    auVar35._0_8_ = lVar45;
                    auVar36._8_8_ = lVar44;
                    auVar36._0_8_ = lVar43;
                    piVar5 = ((ppVar8->field_4).rowcols)->score_row;
                    *(int *)((long)piVar5 + lVar22) = (int)lVar16;
                    *(int *)((long)piVar5 + size * uVar25 * 4 + lVar22) = (int)lVar41;
                    lVar21 = lVar21 + 0x10;
                    lVar22 = lVar22 + uVar25 * 4;
                  } while (lVar20 != lVar21);
                  lVar14 = lVar14 + 4;
                } while (uVar23 != uVar11);
                alVar29 = ptr_02[(uint)(iVar13 % iVar26)];
                auVar28 = alVar29._0_12_;
                if (iVar13 / iVar26 < 1) {
                  do {
                    auVar6._8_8_ = 0;
                    auVar6._0_8_ = alVar29[0];
                    alVar29 = (__m128i)(auVar6 << 0x40);
                    auVar28 = alVar29._0_12_;
                  } while (iVar13 / iVar26 < 0);
                }
                auVar32._8_8_ = -(ulong)(lVar46 <= (long)uVar12);
                auVar32._0_8_ = -(ulong)(lVar45 <= (long)uVar12);
                auVar34._8_8_ = -(ulong)(lVar9 < lVar44);
                auVar34._0_8_ = -(ulong)(lVar9 < lVar43);
                auVar34 = auVar34 | auVar32;
                if ((((((((((((((((auVar34 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                                 (auVar34 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                                && (auVar34 >> 0x17 & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                               (auVar34 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                              && (auVar34 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                             && (auVar34 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                            && (auVar34 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                           && (auVar34 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar34 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar34 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar34 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar34 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar34 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar34 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar34 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    -1 < auVar34[0xf]) {
                  iVar18 = auVar28._8_4_;
                }
                else {
                  *(byte *)&ppVar8->flag = (byte)ppVar8->flag | 0x40;
                  iVar18 = 0;
                  iVar7 = 0;
                  iVar13 = 0;
                }
                ppVar8->score = iVar18;
                ppVar8->end_query = iVar13;
                ppVar8->end_ref = iVar7;
                parasail_free(ptr_03);
                parasail_free(ptr_02);
                parasail_free(ptr_01);
                parasail_free(ptr_00);
                parasail_free(ptr);
                return ppVar8;
              }
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvE = NULL;
    int64_t* restrict boundary = NULL;
    __m128i* restrict pvHt = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    __m128i vZero;
    int64_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 2; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP = (__m128i*)profile->profile64.score;
    vGapO = _mm_set1_epi64x_rpl(open);
    vGapE = _mm_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInfFront = vZero;
    vNegInfFront = _mm_insert_epi64_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_add_epi64(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi64x_rpl(-segLen*gap), 8));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int64_t(16, s2Len+1);
    pvHt= parasail_memalign___m128i(16, segLen);
    pvH = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!boundary) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvGapper) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_64_t h;
            __m128i_64_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
            }
            _mm_store_si128(&pvH[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT64_MIN ? INT64_MIN : tmp;
        }
    }

    {
        __m128i vGapper = _mm_sub_epi64(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            vGapper = _mm_sub_epi64(vGapper, vGapE);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vHt;
        __m128i vF;
        __m128i vH;
        __m128i vHp;
        __m128i *pvW;
        __m128i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHp = _mm_slli_si128(vHp, 8);
        vHp = _mm_insert_epi64_rpl(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm_sub_epi64(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vE = _mm_load_si128(pvE+i);
            vW = _mm_load_si128(pvW+i);
            vE = _mm_max_epi64_rpl(
                    _mm_sub_epi64(vE, vGapE),
                    _mm_sub_epi64(vH, vGapO));
            vHp = _mm_add_epi64(vHp, vW);
            vF = _mm_max_epi64_rpl(vF, _mm_add_epi64(vHt, pvGapper[i]));
            vHt = _mm_max_epi64_rpl(vE, vHp);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 8);
        vHt = _mm_insert_epi64_rpl(vHt, boundary[j+1], 0);
        vF = _mm_max_epi64_rpl(vF, _mm_add_epi64(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 8);
            vFt = _mm_add_epi64(vFt, vSegLenXgap);
            vF = _mm_max_epi64_rpl(vF, vFt);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 8);
        vF = _mm_add_epi64(vF, vNegInfFront);
        vH = _mm_max_epi64_rpl(vHt, vF);
        for (i=0; i<segLen; ++i) {
            vHt = _mm_load_si128(pvHt+i);
            vF = _mm_max_epi64_rpl(
                    _mm_sub_epi64(vF, vGapE),
                    _mm_sub_epi64(vH, vGapO));
            vH = _mm_max_epi64_rpl(vHt, vF);
            _mm_store_si128(pvH+i, vH);
            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
        } 


#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 8);
            }
            result->rowcols->score_row[j] = (int64_t) _mm_extract_epi64_rpl (vH, 1);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvH + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128(vH, 8);
        }
        score = (int64_t) _mm_extract_epi64_rpl (vH, 1);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi64_rpl(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(boundary);
    parasail_free(pvE);

    return result;
}